

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

Optimizer * __thiscall
CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(NetworkUpdateParameters *this)

{
  Optimizer *this_00;
  NetworkUpdateParameters *this_local;
  
  if (this->optimizer_ == (Optimizer *)0x0) {
    this_00 = (Optimizer *)operator_new(0x20);
    Optimizer::Optimizer(this_00);
    this->optimizer_ = this_00;
  }
  return this->optimizer_;
}

Assistant:

inline ::CoreML::Specification::Optimizer* NetworkUpdateParameters::mutable_optimizer() {
  
  if (optimizer_ == NULL) {
    optimizer_ = new ::CoreML::Specification::Optimizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NetworkUpdateParameters.optimizer)
  return optimizer_;
}